

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O0

int AF_A_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  FState *pFVar1;
  AWeapon *player_00;
  AActor *source;
  uint uVar2;
  FState *flashstate;
  PClassActor *type;
  bool bVar3;
  bool local_72;
  bool local_6f;
  FName local_6c;
  FState *local_68;
  FState *flash;
  AWeapon *weapon;
  player_t *player;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                  ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_6f = true;
    if (stateowner != (AActor *)0x0) {
      local_6f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_6f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_72 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_72 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_72 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                      ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      player = (player_t *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      player = (player_t *)0x0;
    }
    weapon = (AWeapon *)stateowner->player;
    if (weapon != (AWeapon *)0x0) {
      flash = (FState *)stateowner->player->ReadyWeapon;
      if (((((AWeapon *)flash != (AWeapon *)0x0) && (stateowner->player != (player_t *)0x0)) &&
          (player != (player_t *)0x0)) && (*(int *)&player->playerstate == 1)) {
        bVar3 = AWeapon::DepleteAmmo
                          ((AWeapon *)flash,(bool)(((AWeapon *)flash)->bAltFire & 1),true,1);
        pFVar1 = flash;
        if (!bVar3) {
          return 0;
        }
        FName::FName(&local_6c,NAME_Flash);
        flashstate = AActor::FindState((AActor *)pFVar1,&local_6c);
        player_00 = weapon;
        pFVar1 = flash;
        local_68 = flashstate;
        if (flashstate != (FState *)0x0) {
          uVar2 = FRandom::operator()(&pr_fireplasma);
          P_SetSafeFlash((AWeapon *)pFVar1,(player_t *)player_00,flashstate,uVar2 & 1);
        }
      }
      source = stateowner;
      type = PClass::FindActor("PlasmaBall");
      P_SpawnPlayerMissile(source,type);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != NULL)
		{
			P_SetSafeFlash(weapon, player, flash, (pr_fireplasma()&1));
		}
	}

	P_SpawnPlayerMissile (self, PClass::FindActor("PlasmaBall"));
	return 0;
}